

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkShareOptimize(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Ntk_t *pAVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar3;
  int i;
  Vec_Int_t *vOld2;
  Vec_Int_t *vOld1;
  Vec_Int_t *vNew;
  Vec_Int_t *vInput2;
  Vec_Int_t *vInput;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Abc_Obj_t *pObj;
  Abc_ShaMan_t *pAStack_10;
  int fAnd_local;
  Abc_ShaMan_t *p_local;
  
  pObj._4_4_ = fAnd;
  pAStack_10 = p;
  while( true ) {
    Abc_NtkShareFindBestMatch(pAStack_10->vBuckets,&vInput2,&vNew);
    if (vInput2 == (Vec_Int_t *)0x0) break;
    pAVar1 = pAStack_10->pNtk;
    iVar2 = Vec_IntEntry(vInput2,0);
    pObj1 = Abc_ObjFromLit(pAVar1,iVar2);
    pAVar1 = pAStack_10->pNtk;
    iVar2 = Vec_IntEntry(vNew,0);
    vInput = (Vec_Int_t *)Abc_ObjFromLit(pAVar1,iVar2);
    if (pObj._4_4_ == 0) {
      pObj0 = Abc_AigXor((Abc_Aig_t *)pAStack_10->pNtk->pManFunc,pObj1,(Abc_Obj_t *)vInput);
    }
    else {
      pObj0 = Abc_AigAnd((Abc_Aig_t *)pAStack_10->pNtk->pManFunc,pObj1,(Abc_Obj_t *)vInput);
    }
    pAStack_10->nCountGates = pAStack_10->nCountGates + 1;
    p_01 = Vec_IntAlloc(0x10);
    iVar2 = Vec_IntEntry(vInput2,0);
    Vec_IntPush(p_01,iVar2);
    iVar2 = Vec_IntEntry(vInput2,1);
    Vec_IntPush(p_01,iVar2);
    p_02 = Vec_IntAlloc(0x10);
    iVar2 = Vec_IntEntry(vNew,0);
    Vec_IntPush(p_02,iVar2);
    iVar2 = Vec_IntEntry(vNew,1);
    Vec_IntPush(p_02,iVar2);
    p_03 = Vec_IntAlloc(0x10);
    iVar2 = Abc_ObjToLit(pObj0);
    Vec_IntPush(p_03,iVar2);
    pObj_00 = Abc_ObjRegular(pObj0);
    iVar2 = Abc_ObjLevel(pObj_00);
    Vec_IntPush(p_03,iVar2);
    vInput2->pArray = vInput2->pArray + 2;
    vNew->pArray = vNew->pArray + 2;
    vInput2->nSize = vInput2->nSize + -2;
    vNew->nSize = vNew->nSize + -2;
    Vec_IntTwoSplit(vInput2,vNew,p_03,p_01,p_02);
    vInput2->pArray = vInput2->pArray + -2;
    vNew->pArray = vNew->pArray + -2;
    vInput2->nSize = vInput2->nSize + 2;
    vNew->nSize = vNew->nSize + 2;
    iVar2 = Vec_IntSize(pAStack_10->vObj2Lit);
    Vec_IntPush(p_01,iVar2);
    iVar2 = Vec_IntSize(pAStack_10->vObj2Lit);
    Vec_IntPush(p_02,iVar2);
    p_00 = pAStack_10->vObj2Lit;
    iVar2 = Abc_ObjToLit(pObj0);
    Vec_IntPush(p_00,iVar2);
    pVVar3 = pAStack_10->vBuckets;
    iVar2 = Vec_IntSize(p_01);
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar3,iVar2 + -2);
    Vec_PtrPush(pVVar3,p_01);
    pVVar3 = pAStack_10->vBuckets;
    iVar2 = Vec_IntSize(p_02);
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar3,iVar2 + -2);
    Vec_PtrPush(pVVar3,p_02);
    pVVar3 = pAStack_10->vBuckets;
    iVar2 = Vec_IntSize(p_03);
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar3,iVar2 + -2);
    Vec_PtrPush(pVVar3,p_03);
    Vec_IntFree(vInput2);
    Vec_IntFree(vNew);
  }
  return;
}

Assistant:

void Abc_NtkShareOptimize( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Obj_t * pObj, * pObj0, * pObj1;
    Vec_Int_t * vInput, * vInput2;
    Vec_Int_t * vNew, * vOld1, * vOld2;
    int i;
    for ( i = 0; ; i++ )
    {
        Abc_NtkShareFindBestMatch( p->vBuckets, &vInput, &vInput2 );
        if ( vInput == NULL )
            break;

        // create new node
        pObj0 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput,  0) );
        pObj1 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput2, 0) );
        if ( fAnd )
            pObj  = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        else
            pObj  = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        p->nCountGates++;

        // save new node
        vOld1 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  0) );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  1) );
        vOld2 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 0) );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 1) );
        vNew  = Vec_IntAlloc( 16 );  Vec_IntPush( vNew,  Abc_ObjToLit(pObj) );        Vec_IntPush( vNew, Abc_ObjLevel(Abc_ObjRegular(pObj)) );

        // compute new arrays
        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Vec_IntTwoSplit( vInput, vInput2, vNew, vOld1, vOld2 );

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        // add to the old ones
        Vec_IntPush( vOld1, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( vOld2, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );

        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld1)-SHARE_NUM), vOld1 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld2)-SHARE_NUM), vOld2 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vNew)-SHARE_NUM), vNew );

        Vec_IntFree( vInput );
        Vec_IntFree( vInput2 );
    }
}